

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O2

reusable_block_list fdb_get_reusable_block(fdb_kvs_handle *handle,stale_header_info stale_header)

{
  avl_tree *mergetree;
  btreeblk_handle *pbVar1;
  avl_node *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  undefined8 uVar6;
  bid_t __ptr;
  uint uVar7;
  btree_result bVar8;
  avl_node *paVar9;
  avl_node *paVar10;
  void *pvVar11;
  long lVar12;
  int64_t iVar13;
  list *plVar14;
  list_elem *plVar15;
  reusable_block *__ptr_00;
  long *plVar16;
  uint uVar17;
  uint64_t offset;
  avl_node *paVar18;
  list_elem *e;
  ulong uVar19;
  int iVar20;
  avl_node *e_00;
  ulong uVar21;
  ulong uVar22;
  reusable_block_list rVar23;
  ulong local_1f8;
  void *local_1e8;
  avl_node *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  filemgr_header_revnum_t _revnum;
  list_elem *local_1b8;
  avl_node *local_1b0;
  bid_t prev_hdr;
  bid_t prev_offset;
  docio_object doc;
  bid_t _offset;
  stale_regions local_148;
  btree_iterator bit;
  kvs_stat stat;
  uint8_t keybuf [64];
  
  local_1b0 = (avl_node *)stale_header.revnum;
  prev_hdr = 0xffffffffffffffff;
  doc.length.keylen = 0;
  doc.length.metalen = 0;
  doc.length.bodylen = 0;
  doc.length.bodylen_ondisk = 0;
  doc.length.flag = '\0';
  doc.length.checksum = '\0';
  doc.length.reserved = 0;
  doc._16_8_ = doc._16_8_ & 0xffffffff00000000;
  doc.key = (void *)0x0;
  doc.field_3.seqnum = 0;
  doc.meta = (void *)0x0;
  doc.body = (void *)0x0;
  mergetree = &handle->file->mergetree;
  local_1f8 = 0;
  _kvs_stat_get(handle->file,0,&stat);
  pbVar1 = handle->bhandle;
  pbVar1->nlivenodes = stat.nlivenodes;
  pbVar1->ndeltanodes = stat.nlivenodes;
  local_1e8 = calloc(0x100,8);
  local_1b8 = handle->file->stale_list->tail;
  paVar9 = avl_first(&handle->file->stale_info_tree);
  if (paVar9 == (avl_node *)0x0) {
    btree_iterator_init(handle->staletree,&bit,(void *)0x0);
    local_1e0 = (avl_node *)0x100;
    local_1f8 = 0;
    paVar9 = (avl_node *)0x0;
    while( true ) {
      bVar8 = btree_next(&bit,&_revnum,&_offset);
      btreeblk_end(handle->bhandle);
      if ((bVar8 != BTREE_RESULT_SUCCESS) ||
         (paVar18 = (avl_node *)
                    (_revnum >> 0x38 | (_revnum & 0xff000000000000) >> 0x28 |
                     (_revnum & 0xff0000000000) >> 0x18 | (_revnum & 0xff00000000) >> 8 |
                     (_revnum & 0xff000000) << 8 | (_revnum & 0xff0000) << 0x18 |
                     (_revnum & 0xff00) << 0x28 | _revnum << 0x38), local_1b0 < paVar18)) break;
      uVar17 = (int)local_1f8 + 1;
      *(avl_node **)((long)local_1e8 + local_1f8 * 8) = paVar18;
      if ((uint)local_1e0 <= uVar17) {
        local_1e0 = (avl_node *)(ulong)((uint)local_1e0 * 2);
        local_1e8 = realloc(local_1e8,(long)local_1e0 * 8);
      }
      uVar22 = _offset >> 0x38 | (_offset & 0xff000000000000) >> 0x28 |
               (_offset & 0xff0000000000) >> 0x18 | (_offset & 0xff00000000) >> 8 |
               (_offset & 0xff000000) << 8 | (_offset & 0xff0000) << 0x18 |
               (_offset & 0xff00) << 0x28 | _offset << 0x38;
      while (offset = uVar22, paVar9 = paVar18, local_1f8 = (ulong)uVar17,
            offset != 0xffffffffffffffff) {
        doc.timestamp = 0;
        doc._20_4_ = 0;
        doc.body = (void *)0x0;
        doc.field_3.seqnum = 0;
        doc.meta = (void *)0x0;
        doc.length.keylen = 0;
        doc.length.metalen = 0;
        doc.length.bodylen = 0;
        doc.length.bodylen_ondisk = 0;
        doc.length.flag = '\0';
        doc.length.checksum = '\0';
        doc.length.reserved = 0;
        doc.key = keybuf;
        iVar13 = docio_read_doc(handle->dhandle,offset,&doc,true);
        uVar22 = 0xffffffffffffffff;
        if (0 < iVar13) {
          _fetch_stale_info_doc(doc.body,mergetree,&prev_offset,&prev_hdr);
          filemgr_actual_stale_regions
                    (&local_148,handle->file,offset,
                     (ulong)((doc.length._0_4_ & 0xffff) + ((uint)doc.length._0_4_ >> 0x10) +
                            doc.length.bodylen_ondisk) + 0x20);
          uVar6 = local_148.field_1.regions;
          sVar5 = local_148.n_regions;
          if (local_148.n_regions < 2) {
            _insert_n_merge(mergetree,local_148.field_1.region.pos,local_148.field_1.region.len);
          }
          else {
            for (uVar7 = 0; uVar22 = (ulong)uVar7, uVar22 < sVar5; uVar7 = uVar7 + 1) {
              _insert_n_merge(mergetree,((stale_data *)(uVar6 + uVar22 * 0x28))->pos,
                              ((stale_data *)(uVar6 + uVar22 * 0x28))->len);
            }
            free((void *)uVar6);
          }
          free(doc.body);
          uVar22 = prev_offset;
        }
      }
    }
    btree_iterator_free(&bit);
    local_1e0 = paVar9;
  }
  else {
    local_1d0 = 0x100;
    local_1e0 = (avl_node *)0x0;
    while (paVar9 != (avl_node *)0x0) {
      paVar10 = avl_next(paVar9);
      paVar18 = paVar9[1].parent;
      if (local_1b0 < paVar18) break;
      uVar17 = (int)local_1f8 + 1;
      *(avl_node **)((long)local_1e8 + local_1f8 * 8) = paVar18;
      pvVar11 = local_1e8;
      if ((uint)local_1d0 <= uVar17) {
        local_1d0 = (ulong)((uint)local_1d0 * 2);
        pvVar11 = realloc(local_1e8,local_1d0 * 8);
        if (pvVar11 == (void *)0x0) {
          local_1d8 = 0;
          fdb_log_impl((err_log_callback *)0x0,2,FDB_RESULT_ALLOC_FAIL,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/staleblock.cc"
                       ,"fdb_get_reusable_block",0x298,
                       "(fdb_get_reusable_block) realloc of \'revnum_array\' failed: database file \'%s\', max_revnum_array %d\n"
                       ,handle->file->filename,local_1d0);
          free(local_1e8);
          __ptr_00 = (reusable_block *)0x0;
          goto LAB_00134a53;
        }
      }
      local_1e8 = pvVar11;
      avl_remove(&handle->file->stale_info_tree,paVar9);
      e_00 = paVar9[1].left;
      while (e_00 != (avl_node *)0x0) {
        paVar2 = e_00->left;
        list_remove((list *)&paVar9[1].left,(list_elem *)e_00);
        if (e_00->right != (avl_node *)0x0) {
          _fetch_stale_info_doc(e_00->right,mergetree,&prev_offset,&prev_hdr);
        }
        filemgr_actual_stale_regions
                  ((stale_regions *)&bit,handle->file,(bid_t)e_00[1].parent,(size_t)e_00[1].left);
        __ptr = bit.btree.root_bid;
        uVar6 = bit.btree._0_8_;
        if ((ulong)bit.btree._0_8_ < 2) {
          _insert_n_merge(mergetree,bit.btree.root_bid,(uint32_t)bit.btree.blk_handle);
        }
        else {
          for (uVar7 = 0; (ulong)uVar7 < (ulong)uVar6; uVar7 = uVar7 + 1) {
            lVar12 = (ulong)uVar7 * 0x28;
            _insert_n_merge(mergetree,*(uint64_t *)(__ptr + lVar12),
                            *(uint32_t *)(__ptr + 8 + lVar12));
          }
          free((void *)__ptr);
        }
        free(e_00->right);
        free(e_00);
        e_00 = paVar2;
      }
      free(paVar9);
      paVar9 = paVar10;
      local_1e0 = paVar18;
      local_1f8 = (ulong)uVar17;
    }
  }
  for (uVar22 = 0; local_1f8 != uVar22; uVar22 = uVar22 + 1) {
    uVar19 = *(ulong *)((long)local_1e8 + uVar22 * 8);
    _revnum = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
              (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
              (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28 |
              uVar19 << 0x38;
    btree_remove(handle->staletree,&_revnum);
    btreeblk_end(handle->bhandle);
  }
  _kvs_stat_update_attr
            (handle->file,0,KVS_STAT_NLIVENODES,handle->bhandle->nlivenodes - stat.nlivenodes);
  _kvs_stat_update_attr
            (handle->file,0,KVS_STAT_DELTASIZE,
             (ulong)(handle->config).blocksize * (handle->bhandle->ndeltanodes - stat.nlivenodes));
  if (local_1b8 == (list_elem *)0x0) {
    plVar14 = handle->file->stale_list;
  }
  else {
    plVar14 = (list *)&local_1b8->next;
  }
  e = plVar14->head;
  while (e != (list_elem *)0x0) {
    plVar15 = list_remove(handle->file->stale_list,e);
    _insert_n_merge(mergetree,(uint64_t)e[-1].prev,*(uint32_t *)&e[-1].next);
    free(e + -1);
    e = plVar15;
  }
  uVar17 = handle->file->blocksize;
  uVar19 = CONCAT44(0,uVar17);
  __ptr_00 = (reusable_block *)calloc(0x100,0x10);
  paVar9 = avl_first(mergetree);
  local_1f8 = 0x100;
  local_1d8 = 0;
  uVar22 = local_1d8;
  while (local_1d8 = uVar22, paVar18 = paVar9, paVar18 != (avl_node *)0x0) {
    paVar9 = avl_next(paVar18);
    uVar22 = local_1d8;
    if (uVar17 <= *(uint *)&paVar18[-1].right) {
      uVar21 = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar19;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = paVar18[-1].left;
      if (SUB168(auVar4 % auVar3,0) != 0) {
        uVar21 = (ulong)(uVar17 - SUB164(auVar4 % auVar3,0));
      }
      iVar20 = (int)uVar21;
      uVar7 = *(uint *)&paVar18[-1].right - iVar20;
      if (uVar17 <= uVar7) {
        __ptr_00[local_1d8].bid = ((long)&(paVar18[-1].left)->parent + uVar21) / uVar19;
        __ptr_00[local_1d8].count = (ulong)uVar7 / (ulong)uVar17;
        uVar22 = local_1d8 + 1;
        if (local_1f8 <= uVar22) {
          local_1f8 = (ulong)(uint)((int)local_1f8 * 2);
          __ptr_00 = (reusable_block *)realloc(__ptr_00,local_1f8 << 4);
        }
        if (iVar20 == 0) {
          avl_remove(mergetree,paVar18);
          free(&paVar18[-1].left);
        }
        else {
          *(int *)&paVar18[-1].right = iVar20;
        }
        if (uVar7 % uVar17 != 0) {
          plVar16 = (long *)calloc(1,0x28);
          *plVar16 = (__ptr_00[local_1d8].count + __ptr_00[local_1d8].bid) * uVar19;
          *(uint *)(plVar16 + 1) = uVar7 % uVar17;
          avl_insert(mergetree,(avl_node *)(plVar16 + 2),_reusable_offset_cmp);
          paVar9 = avl_next((avl_node *)(plVar16 + 2));
        }
      }
    }
  }
  fdb_gather_stale_blocks
            (handle,(filemgr_header_revnum_t)local_1e0,0xffffffffffffffff,0xffffffffffffffff,0,
             local_1b8,true);
  free(local_1e8);
LAB_00134a53:
  rVar23.blocks = __ptr_00;
  rVar23.n_blocks = local_1d8;
  return rVar23;
}

Assistant:

reusable_block_list fdb_get_reusable_block(fdb_kvs_handle *handle,
                                           stale_header_info stale_header)
{
    int64_t delta;
    int r;
    uint8_t keybuf[64];
    uint32_t i;
    uint32_t item_len;
    uint32_t n_revnums, max_revnum_array = 256;
    uint64_t item_pos;
    btree_iterator bit;
    btree_result br;
    filemgr_header_revnum_t revnum_upto, prev_revnum = 0;
    filemgr_header_revnum_t revnum = 0, _revnum;
    filemgr_header_revnum_t *revnum_array;
    bid_t offset, _offset, prev_offset;
    bid_t prev_hdr = BLK_NOT_FOUND;
    bool stale_tree_scan = true;
    struct docio_object doc;
    struct avl_tree *mergetree = &handle->file->mergetree;
    struct avl_node *avl;
    struct stale_data *item;
    struct list_elem *e, *e_last;
    struct kvs_stat stat;

    revnum_upto = stale_header.revnum;

    r = _kvs_stat_get(handle->file, 0, &stat);
    handle->bhandle->nlivenodes = stat.nlivenodes;
    handle->bhandle->ndeltanodes = stat.nlivenodes;
    (void)r;

    revnum_array = (filemgr_header_revnum_t *)
                   calloc(max_revnum_array, sizeof(filemgr_header_revnum_t));
    n_revnums = 0;

    // remember the last stale list item to be preserved
    e_last = list_end(handle->file->stale_list);

    avl = avl_first(&handle->file->stale_info_tree);
    if (avl) {
        // if in-memory stale info exists
        void *uncomp_buf = NULL;
        size_t uncomp_buflen = 128*1024; // 128 KB by default;
        struct stale_info_commit *commit;
        struct stale_info_entry *entry;

        stale_tree_scan = false;

        if (compress_inmem_stale_info) {
            uncomp_buf = (void*)calloc(1, uncomp_buflen);
            if (!uncomp_buf) {
                fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                        "(fdb_get_reusable_block) "
                        "calloc of 'uncomp_buf' failed: "
                        "database file '%s', "
                        "uncomp_buflen %d\n",
                        handle->file->filename,
                        (int)uncomp_buflen);
                free(revnum_array);

                reusable_block_list ret;
                ret.n_blocks = 0;
                ret.blocks = NULL;

                return ret;
            }
        }

        while (avl) {
            commit = _get_entry(avl, struct stale_info_commit, avl);
            avl = avl_next(avl);

            prev_revnum = revnum;
            revnum = commit->revnum;
            if (revnum > revnum_upto) {
                revnum = prev_revnum;
                break;
            }

            filemgr_header_revnum_t *new_revnum_array = revnum_array;
            revnum_array[n_revnums++] = revnum;
            if (n_revnums >= max_revnum_array) {
                max_revnum_array *= 2;
                new_revnum_array = (filemgr_header_revnum_t *)
                                   realloc(revnum_array, max_revnum_array *
                                           sizeof(filemgr_header_revnum_t));
            }
            if (!new_revnum_array) {
                // realloc() of revnum_array failed.
                fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                        "(fdb_get_reusable_block) "
                        "realloc of 'revnum_array' failed: "
                        "database file '%s', "
                        "max_revnum_array %d\n",
                        handle->file->filename,
                        (int)max_revnum_array);
                free(uncomp_buf);
                free(revnum_array);

                reusable_block_list ret;
                ret.n_blocks = 0;
                ret.blocks = NULL;

                return ret;
            }
            revnum_array = new_revnum_array;

            avl_remove(&handle->file->stale_info_tree, &commit->avl);

            e = list_begin(&commit->doc_list);
            while (e) {
                entry = _get_entry(e, struct stale_info_entry, le);
                e = list_next(&entry->le);
                list_remove(&commit->doc_list, &entry->le);

                if (entry->ctx) {
#ifdef _DOC_COMP
                    if (compress_inmem_stale_info) {
                        // uncompression
                        void* new_uncomp_buf = uncomp_buf;
                        if (uncomp_buflen < entry->ctxlen) {
                            uncomp_buflen = entry->ctxlen;
                            new_uncomp_buf = (void*)realloc(uncomp_buf, uncomp_buflen);
                        }

                        if (!new_uncomp_buf) {
                            // realloc() of uncomp_buf failed.
                            fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                                    "(fdb_get_reusable_block) "
                                    "realloc of 'uncomp_buf' failed: "
                                    "database file '%s', "
                                    "uncomp_buflen %d, "
                                    "entry->ctxlen %d\n",
                                    handle->file->filename,
                                    (int)uncomp_buflen,
                                    (int)entry->ctxlen);
                            free(uncomp_buf);
                            free(revnum_array);

                            reusable_block_list ret;
                            ret.n_blocks = 0;
                            ret.blocks = NULL;

                            return ret;
                        }
                        uncomp_buf = new_uncomp_buf;

                        size_t len = uncomp_buflen;
                        int r = snappy_uncompress
                                ( (char*)entry->ctx, entry->comp_ctxlen,
                                  (char*)uncomp_buf, &len );
                        if (r != 0) {
                            fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_COMPRESSION_FAIL,
                                    "(fdb_get_reusable_block) "
                                    "Uncompression error from a database file '%s'"
                                    ": return value %d, header revnum %" _F64 ", "
                                    "doc offset %" _F64 "\n",
                                    handle->file->filename, r, revnum, entry->offset);
                            free(uncomp_buf);
                            free(revnum_array);

                            reusable_block_list ret;
                            ret.n_blocks = 0;
                            ret.blocks = NULL;

                            return ret;
                        }

                        // fetch the context
                        _fetch_stale_info_doc(uncomp_buf, mergetree,
                                              prev_offset, prev_hdr);
                    } else {
                        _fetch_stale_info_doc(entry->ctx, mergetree,
                                              prev_offset, prev_hdr);
                    }
#else
                    _fetch_stale_info_doc(entry->ctx, mergetree, prev_offset, prev_hdr);
#endif
                }

                // also insert/merge the system doc region
                struct stale_regions sr;

                sr = filemgr_actual_stale_regions(handle->file, entry->offset,
                                                  entry->doclen);

                if (sr.n_regions > 1) {
                    for (i=0; i<sr.n_regions; ++i){
                        _insert_n_merge(mergetree, sr.regions[i].pos, sr.regions[i].len);
                    }
                    free(sr.regions);
                } else {
                    _insert_n_merge(mergetree, sr.region.pos, sr.region.len);
                }

                free(entry->ctx);
                free(entry);
            }

            free(commit);
        }
        free(uncomp_buf);
    }

    if (stale_tree_scan) {
        // scan stale-block tree and get all stale regions
        // corresponding to commit headers whose seq number is
        // equal to or smaller than 'revnum_upto'
        btree_iterator_init(handle->staletree, &bit, NULL);
        do {
            br = btree_next(&bit, (void*)&_revnum, (void*)&_offset);
            btreeblk_end(handle->bhandle);
            if (br != BTREE_RESULT_SUCCESS) {
                break;
            }

            prev_revnum = revnum;
            revnum = _endian_decode(_revnum);
            if (revnum > revnum_upto) {
                revnum = prev_revnum;
                break;
            }

            revnum_array[n_revnums++] = revnum;
            if (n_revnums >= max_revnum_array) {
                max_revnum_array *= 2;
                revnum_array = (filemgr_header_revnum_t *)
                               realloc(revnum_array, max_revnum_array *
                                   sizeof(filemgr_header_revnum_t));
            }
            offset = _endian_decode(_offset);

            while (offset != BLK_NOT_FOUND) {
                memset(&doc, 0x0, sizeof(doc));
                // pre-allocated buffer for key
                doc.key = (void*)keybuf;

                if (docio_read_doc(handle->dhandle, offset, &doc, true) <= 0) {
                    // read fail .. escape
                    offset = BLK_NOT_FOUND;
                    continue;
                }

                _fetch_stale_info_doc(doc.body, mergetree, prev_offset, prev_hdr);

                // also insert/merge the system doc region
                size_t length = _fdb_get_docsize(doc.length);
                struct stale_regions sr;

                sr = filemgr_actual_stale_regions(handle->file, offset, length);

                if (sr.n_regions > 1) {
                    for (i=0; i<sr.n_regions; ++i){
                        _insert_n_merge(mergetree, sr.regions[i].pos, sr.regions[i].len);
                    }
                    free(sr.regions);
                } else {
                    _insert_n_merge(mergetree, sr.region.pos, sr.region.len);
                }

                // We don't need to free 'meta' as it will be NULL.
                free(doc.body);

                offset = prev_offset;
            }
        } while (true);
        btree_iterator_free(&bit);
    }

    // remove merged commit headers
    for (i=0; i<n_revnums; ++i) {
        _revnum = _endian_encode(revnum_array[i]);
        btree_remove(handle->staletree, (void*)&_revnum);
        btreeblk_end(handle->bhandle);
    }

    delta = handle->bhandle->nlivenodes - stat.nlivenodes;
    _kvs_stat_update_attr(handle->file, 0, KVS_STAT_NLIVENODES, delta);
    delta = handle->bhandle->ndeltanodes - stat.nlivenodes;
    delta *= handle->config.blocksize;
    _kvs_stat_update_attr(handle->file, 0, KVS_STAT_DELTASIZE, delta);

    // gather stale blocks generated by removing b+tree entries
    if (e_last) {
        e = list_next(e_last);
    } else {
        e = list_begin(handle->file->stale_list);
    }
    while (e) {
        item = _get_entry(e, struct stale_data, le);
        e = list_remove(handle->file->stale_list, e);

        _insert_n_merge(mergetree, item->pos, item->len);
        free(item);
    }

    // now merge stale regions as large as possible
    size_t n_blocks =0 ;
    size_t blocksize = handle->file->blocksize;
    uint32_t max_blocks = 256;
    uint32_t front_margin;
    reusable_block_list ret;
    struct reusable_block *blocks_arr;

    blocks_arr = (struct reusable_block*)
        calloc(max_blocks, sizeof(struct reusable_block));

    avl = avl_first(mergetree);
    while (avl) {
        item = _get_entry(avl, struct stale_data, avl);
        avl = avl_next(avl);

        // A stale region can be represented as follows:
        //
        //  block x-1 |   block x  |  block x+1 |  block x+2
        //  -----+----+------------+------------+--------+----
        //   ... |  A |      B     |      C     |    D   | ...
        //  -----+----+------------+------------+--------+----
        //
        // Only segment 'B' and 'C' can be reusable, and the other segments
        // (i.e., 'A' and 'D') should be re-inserted into stale-block tree.

        if (item->len < blocksize) {
            // whole region is smaller than a block .. skip this item
            //       |    block    |  ...
            //  -----+---+-----+---+-------
            //   ... |   |/////|   |  ...
            //  -----+---+-----+---+-------
            continue;
        }

        //            <------------ item_len ------------>
        //  block x-1 |   block x  |  block x+1 |  block x+2
        //  -----+----+------------+------------+--------+----
        //   ... |  A |      B     |      C     |    D   | ...
        //  -----+----+------------+------------+--------+----
        //            ^
        //            item_pos
        if (item->pos % blocksize) {
            front_margin = blocksize - item->pos % blocksize;
        } else {
            front_margin = 0;
        }
        item_pos = item->pos + front_margin;
        item_len = item->len - front_margin;

        if (item_len < blocksize) {
            // Remaining length is smaller than a block. This means that there
            // is no reusable block in this region (even though the region size is
            // bigger than a block size) .. skip this item.
            //
            //       |   block x   |  block x+1  | ...
            //  -----+------+------+-------+-----+----
            //   ... |      |//////|///////|     | ...
            //  -----+------+------+-------+-----+----
            continue;
        }

        // calculate # blocks and add to 'blocks'
        blocks_arr[n_blocks].bid = item_pos / blocksize;
        blocks_arr[n_blocks].count = item_len / blocksize;
        n_blocks += 1;
        if (n_blocks >= max_blocks) {
            max_blocks *= 2;
            blocks_arr = (struct reusable_block*)
                realloc(blocks_arr, max_blocks * sizeof(struct reusable_block));
        }

        if (front_margin) {
            // adjust the existing item to indicate 'A' in above example
            item->len = front_margin;
        } else {
            // exactly aligned .. remove this item
            avl_remove(mergetree, &item->avl);
            free(item);
        }

        uint32_t remaining_len;
        remaining_len = item_len % blocksize;
        if (remaining_len) {
            // add a new item for the remaining region ('D' in above example)
            struct stale_data *new_item;
            new_item = (struct stale_data *)
                       calloc(1, sizeof(struct stale_data));
            new_item->pos = (blocks_arr[n_blocks-1].bid + blocks_arr[n_blocks-1].count)
                            * blocksize;
            new_item->len = remaining_len;
            avl_insert(mergetree, &new_item->avl, _reusable_offset_cmp);
            avl = avl_next(&new_item->avl);
        }
    }

    // re-write stale tree using the last revnum as a key
    // in this case, only stale regions newly generated by this function are gathered,
    // and prev_hdr is set to BLK_NOT_FOUND, as corresponding seq numbers are
    // already removed.

    // however, do not remove the remaining items in the merge-tree and continue to
    // merge them in the next block reclaim.
    fdb_gather_stale_blocks(handle, revnum, BLK_NOT_FOUND, BLK_NOT_FOUND,
                            0, e_last, true);

    free(revnum_array);

    ret.n_blocks = n_blocks;
    ret.blocks = blocks_arr;
    return ret;
}